

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void __thiscall cmServer::DebugInfo::DebugInfo(DebugInfo *this)

{
  uint64_t uVar1;
  DebugInfo *this_local;
  
  this->PrintStatistics = false;
  std::__cxx11::string::string((string *)&this->OutputFile);
  uVar1 = uv_hrtime();
  this->StartTime = uVar1;
  return;
}

Assistant:

DebugInfo()
    : StartTime(uv_hrtime())
  {
  }